

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O0

int FFSread_raw_header(FFSFile file,void *dest,int buffer_size,FFSTypeHandle_conflict *fp)

{
  FFSTypeHandle_conflict ioformat;
  int iVar1;
  long lVar2;
  undefined4 uVar3;
  undefined8 *in_RCX;
  void *in_RSI;
  long in_RDI;
  size_t read_size;
  int header_size;
  FFSTypeHandle_conflict f;
  FFSFile in_stack_00000078;
  FFSFile in_stack_ffffffffffffffb8;
  
  if (*(int *)(in_RDI + 0xb0) == 0) {
    if (*(int *)(in_RDI + 0x48) == 0) {
      next_record_type(in_stack_00000078);
    }
    do {
      if (*(int *)(in_RDI + 0x54) == 4) {
        ioformat = *(FFSTypeHandle_conflict *)(in_RDI + 0x60);
        *in_RCX = ioformat;
        iVar1 = FFSheader_size(ioformat);
        lVar2 = *(long *)(in_RDI + 0x38) - (long)iVar1;
        memset(in_RSI,0,(long)iVar1);
        memcpy(in_RSI,(ioformat->body->server_ID).value,(long)(ioformat->body->server_ID).length);
        iVar1 = (**(code **)(in_RDI + 0xc0))
                          (*(undefined8 *)(in_RDI + 0x20),(long)in_RSI + (long)iVar1,lVar2,0);
        if (iVar1 == lVar2) {
          *(undefined4 *)(in_RDI + 0x48) = 0;
          return 1;
        }
        uVar3 = 2;
        if (*(int *)(in_RDI + 0x4c) != 0) {
          uVar3 = 1;
        }
        *(undefined4 *)(in_RDI + 0x54) = uVar3;
        return 0;
      }
      iVar1 = FFSconsume_next_item(in_stack_ffffffffffffffb8);
    } while (iVar1 != 0);
  }
  return 0;
}

Assistant:

extern int
FFSread_raw_header(FFSFile file, void *dest, int buffer_size, FFSTypeHandle *fp)
{
    FFSTypeHandle f;
    int header_size;
    size_t read_size;

    if (file->status != OpenForRead)
	return 0;

    if (file->read_ahead == FALSE) {
	(void) next_record_type(file);
    }
    while (file->next_record_type != FFSdata) {
	if (!FFSconsume_next_item(file)) return 0;
    }

    f = file->next_actual_handle;
    *fp = f;
    header_size = FFSheader_size(f);
    read_size = file->next_data_len - header_size;
    /* should have buffer optimization logic here.  
     * I.E. if decode_in_place_possible() handle differently.  later
     */
    /* read into temporary memory */
    memset(dest, 0, header_size);
    memcpy(dest, f->body->server_ID.value, f->body->server_ID.length);
    if (file->read_func(file->file_id, (char*)dest+header_size, read_size, NULL, NULL) != read_size) {
	file->next_record_type = (file->errno_val) ? FFSerror : FFSend;
	return 0;
    }

    file->read_ahead = FALSE;
    return 1;
}